

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O2

void __thiscall
icu_63::PluralFormat::parseType
          (PluralFormat *this,UnicodeString *source,NFRule *rbnfLenientScanner,Formattable *result,
          FieldPosition *pos)

{
  UnicodeString *this_00;
  int iVar1;
  Part *pPVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  int start;
  int iVar7;
  int32_t iVar8;
  int local_15c;
  int local_158;
  UnicodeString currArg;
  UnicodeString matchedWord;
  UnicodeString keyword;
  int32_t length;
  
  iVar1 = (this->msgPattern).partsLength;
  if (iVar1 == 0) {
    pos->fBeginIndex = -1;
    pos->fEndIndex = -1;
    return;
  }
  iVar8 = 0;
  start = pos->fBeginIndex;
  if (pos->fBeginIndex < 1) {
    start = iVar8;
  }
  keyword.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00471e80;
  keyword.fUnion.fStackFields.fLengthAndFlags = 2;
  matchedWord.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00471e80;
  matchedWord.fUnion.fStackFields.fLengthAndFlags = 2;
  this_00 = &(this->msgPattern).msg;
  local_158 = -1;
  do {
    pPVar2 = (this->msgPattern).parts;
    do {
      do {
        do {
          iVar6 = iVar8;
          if (iVar1 <= iVar6) {
            if (local_158 < 0) {
              pos->fBeginIndex = -1;
              pos->fEndIndex = -1;
            }
            else {
              pos->fBeginIndex = local_158;
              if (-1 < matchedWord.fUnion.fStackFields.fLengthAndFlags) {
                matchedWord.fUnion.fFields.fLength =
                     (int)matchedWord.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              pos->fEndIndex = matchedWord.fUnion.fFields.fLength + local_158;
              Formattable::setString(result,&keyword);
            }
            icu_63::UnicodeString::~UnicodeString(&matchedWord);
            icu_63::UnicodeString::~UnicodeString(&keyword);
            return;
          }
          iVar7 = iVar6 + 1;
          iVar8 = iVar7;
        } while (pPVar2[iVar6].type != UMSGPAT_PART_TYPE_ARG_SELECTOR);
        iVar5 = iVar6 + 2;
        iVar8 = iVar5;
      } while (pPVar2[iVar7].type != UMSGPAT_PART_TYPE_MSG_START);
      iVar8 = iVar6 + 3;
    } while (pPVar2[iVar5].type != UMSGPAT_PART_TYPE_MSG_LIMIT);
    iVar6 = (uint)pPVar2[iVar7].length + pPVar2[iVar7].index;
    icu_63::UnicodeString::tempSubString(&currArg,this_00,iVar6,pPVar2[iVar5].index - iVar6);
    if (rbnfLenientScanner == (NFRule *)0x0) {
      local_15c = icu_63::UnicodeString::indexOf(source,&currArg,start);
    }
    else {
      length = -1;
      local_15c = NFRule::findTextLenient(rbnfLenientScanner,source,&currArg,start,&length);
    }
    if (local_158 <= local_15c && -1 < local_15c) {
      uVar3 = currArg.fUnion.fFields.fLength;
      if (-1 < currArg.fUnion.fStackFields.fLengthAndFlags) {
        uVar3 = (int)currArg.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      uVar4 = matchedWord.fUnion.fFields.fLength;
      if (-1 < matchedWord.fUnion.fStackFields.fLengthAndFlags) {
        uVar4 = (int)matchedWord.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if ((int)uVar4 < (int)uVar3) {
        icu_63::UnicodeString::operator=(&matchedWord,&currArg);
        iVar6 = (uint)pPVar2[iVar7].length + pPVar2[iVar7].index;
        icu_63::UnicodeString::tempSubString
                  ((UnicodeString *)&length,this_00,iVar6,pPVar2[iVar5].index - iVar6);
        icu_63::UnicodeString::moveFrom(&keyword,(UnicodeString *)&length);
        icu_63::UnicodeString::~UnicodeString((UnicodeString *)&length);
        local_158 = local_15c;
      }
    }
    icu_63::UnicodeString::~UnicodeString(&currArg);
  } while( true );
}

Assistant:

void PluralFormat::parseType(const UnicodeString& source, const NFRule *rbnfLenientScanner, Formattable& result, FieldPosition& pos) const {
    // If no pattern was applied, return null.
    if (msgPattern.countParts() == 0) {
        pos.setBeginIndex(-1);
        pos.setEndIndex(-1);
        return;
    }
    int partIndex = 0;
    int currMatchIndex;
    int count=msgPattern.countParts();
    int startingAt = pos.getBeginIndex();
    if (startingAt < 0) {
        startingAt = 0;
    }

    // The keyword is null until we need to match against a non-explicit, not-"other" value.
    // Then we get the keyword from the selector.
    // (In other words, we never call the selector if we match against an explicit value,
    // or if the only non-explicit keyword is "other".)
    UnicodeString keyword;
    UnicodeString matchedWord;
    const UnicodeString& pattern = msgPattern.getPatternString();
    int matchedIndex = -1;
    // Iterate over (ARG_SELECTOR ARG_START message ARG_LIMIT) tuples
    // until the end of the plural-only pattern.
    while (partIndex < count) {
        const MessagePattern::Part* partSelector = &msgPattern.getPart(partIndex++);
        if (partSelector->getType() != UMSGPAT_PART_TYPE_ARG_SELECTOR) {
            // Bad format
            continue;
        }

        const MessagePattern::Part* partStart = &msgPattern.getPart(partIndex++);
        if (partStart->getType() != UMSGPAT_PART_TYPE_MSG_START) {
            // Bad format
            continue;
        }

        const MessagePattern::Part* partLimit = &msgPattern.getPart(partIndex++);
        if (partLimit->getType() != UMSGPAT_PART_TYPE_MSG_LIMIT) {
            // Bad format
            continue;
        }

        UnicodeString currArg = pattern.tempSubString(partStart->getLimit(), partLimit->getIndex() - partStart->getLimit());
        if (rbnfLenientScanner != NULL) {
            // If lenient parsing is turned ON, we've got some time consuming parsing ahead of us.
            int32_t length = -1;
            currMatchIndex = rbnfLenientScanner->findTextLenient(source, currArg, startingAt, &length);
        }
        else {
            currMatchIndex = source.indexOf(currArg, startingAt);
        }
        if (currMatchIndex >= 0 && currMatchIndex >= matchedIndex && currArg.length() > matchedWord.length()) {
            matchedIndex = currMatchIndex;
            matchedWord = currArg;
            keyword = pattern.tempSubString(partStart->getLimit(), partLimit->getIndex() - partStart->getLimit());
        }
    }
    if (matchedIndex >= 0) {
        pos.setBeginIndex(matchedIndex);
        pos.setEndIndex(matchedIndex + matchedWord.length());
        result.setString(keyword);
        return;
    }

    // Not found!
    pos.setBeginIndex(-1);
    pos.setEndIndex(-1);
}